

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupTestMemoryAccountant::~TEST_GROUP_CppUTestGroupTestMemoryAccountant
          (TEST_GROUP_CppUTestGroupTestMemoryAccountant *this)

{
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupTestMemoryAccountant_00388500;
  ExecFunctionWithoutParameters::~ExecFunctionWithoutParameters
            ((ExecFunctionWithoutParameters *)&this->testFunction);
  TestTestingFixture::~TestTestingFixture(&this->fixture);
  MemoryAccountant::~MemoryAccountant(&this->accountant);
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_GROUP(TestMemoryAccountant)
{
    MemoryAccountant accountant;
    TestTestingFixture fixture;
    MemoryAccountantExecFunction testFunction;

    void setup() _override
    {
        testFunction.parameter_ = &accountant;
        fixture.setTestFunction(&testFunction);
    }

    void teardown() _override
    {
        accountant.clear();
    }
}